

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
calcOrientationHist(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Mat *image,
                   Point2f *tmp,Point2f *center,double *angle)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  uint uVar9;
  value_type_conflict2 *__val;
  ulong uVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Mat tmp_image;
  Mat rot_mat;
  float local_1dc;
  ulong local_1d0;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  Point2f local_138;
  Mat *local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  Mat *local_118;
  undefined8 uStack_110;
  Mat local_108;
  Mat local_a8;
  undefined4 local_48;
  Mat *local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar5 = (double *)operator_new(0x40);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar5;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar5;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar5 + 8;
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  pdVar5[2] = 0.0;
  pdVar5[3] = 0.0;
  pdVar5[4] = 0.0;
  pdVar5[5] = 0.0;
  pdVar5[6] = 0.0;
  pdVar5[7] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar5 + 8;
  local_138 = *tmp;
  cv::getRotationMatrix2D_(SUB84(*angle,0),0x3ff0000000000000,&local_168);
  local_a8.size.p = &local_a8.rows;
  local_a8.flags = 0x42ff4006;
  local_a8.dims = 2;
  local_a8.rows = 2;
  local_a8.cols = 3;
  local_a8.data = (uchar *)0x0;
  local_a8.datastart = (uchar *)0x0;
  local_a8.dataend = (uchar *)0x0;
  local_a8.datalimit = (uchar *)0x0;
  local_a8.allocator = (MatAllocator *)0x0;
  local_a8.u = (UMatData *)0x0;
  local_a8.step.p = local_a8.step.buf;
  local_a8.step.buf[0] = 0;
  local_a8.step.buf[1] = 0;
  cv::Mat::Mat(&local_108,2,3,6,&local_168,0);
  uStack_110 = 0;
  local_120 = 0x2010000;
  local_118 = &local_a8;
  cv::Mat::copyTo((_OutputArray *)&local_108);
  cv::Mat::~Mat(&local_108);
  cv::Mat::Mat(&local_108);
  uStack_110 = 0;
  local_120 = 0x1010000;
  uStack_128 = 0;
  local_138.x = 9.477423e-38;
  local_38 = 0;
  local_48 = 0x1010000;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_130 = &local_108;
  local_118 = image;
  local_40 = &local_a8;
  cv::warpAffine();
  local_1d0 = (ulong)tmp->y;
  local_1dc = (float)(local_1d0 & 0xffffffff);
  if (local_1dc < tmp->y + 4.0) {
    do {
      uVar10 = (ulong)tmp->x;
      fVar11 = (float)(uVar10 & 0xffffffff);
      if (fVar11 < tmp->x + 4.0) {
        do {
          iVar3 = (int)uVar10;
          uVar9 = iVar3 + 1;
          uVar10 = (ulong)uVar9;
          puVar1 = image->data;
          sVar2 = *(image->step).p;
          dVar13 = (double)puVar1[(long)(int)uVar9 + sVar2 * (long)(int)local_1d0] -
                   (double)puVar1[(long)(iVar3 + -1) + sVar2 * (long)(int)local_1d0];
          dVar12 = (double)puVar1[(long)iVar3 + sVar2 * (long)((int)local_1d0 + 1)] -
                   (double)puVar1[(long)iVar3 + sVar2 * (long)((int)local_1d0 + -1)];
          dVar14 = calAngle(dVar13,dVar12);
          dVar12 = pow(dVar13 * dVar13 + dVar12 * dVar12,0.5);
          iVar3 = (int)(fVar11 - center->x);
          iVar8 = (int)(local_1dc - center->y);
          dVar13 = exp((double)(iVar8 * iVar8 + iVar3 * iVar3) * -0.5 * 0.5 * 0.5);
          uVar4 = (uint)(dVar14 / 45.0);
          if (uVar4 < 10) {
            dVar12 = dVar12 * dVar13 * 0.15915494309189535;
            dVar14 = (dVar14 - (double)(int)(uVar4 * 0x2d)) / 45.0 + -0.5;
            if (dVar14 <= 0.0) {
              dVar14 = ABS(dVar14);
              pdVar5[uVar4] = (1.0 - dVar14 * dVar12) + pdVar5[uVar4];
              pdVar7 = pdVar5 + 7;
              pdVar6 = pdVar5 + -1;
              if (uVar4 != 0) goto LAB_00105670;
            }
            else {
              pdVar5[uVar4] = (1.0 - dVar14) * dVar12 + pdVar5[uVar4];
              pdVar7 = pdVar5;
              pdVar6 = pdVar5 + 1;
              if (uVar4 < 7) {
LAB_00105670:
                pdVar7 = pdVar6 + uVar4;
              }
            }
            *pdVar7 = dVar14 * dVar12 + *pdVar7;
          }
          fVar11 = (float)uVar9;
        } while (fVar11 < tmp->x + 4.0);
      }
      local_1d0 = (ulong)((int)local_1d0 + 1);
      local_1dc = (float)local_1d0;
    } while (local_1dc < tmp->y + 4.0);
  }
  Normalize(__return_storage_ptr__);
  cv::Mat::~Mat(&local_108);
  cv::Mat::~Mat(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

vector<double> calcOrientationHist(const Mat& image, const Point2f& tmp, const Point2f& center, const double& angle){
    vector<double> tmpBin(n_cell_bin);
    Mat rot_mat = getRotationMatrix2D(tmp, angle, 1.0);
    Mat tmp_image;
    warpAffine(image, tmp_image, rot_mat, image.size());
    // imshow("test", tmp_image);
    // waitKey(0);

    for(unsigned r = tmp.y; r < tmp.y+cell_width; r++){
        for(unsigned c = tmp.x; c < tmp.x+cell_width; c++){
            double neighborC, neighborR, neighborAngle, neighborParam, neighborMag;
            neighborC = (double)image.at<uchar>(r, c+1) - (double)image.at<uchar>(r, c-1);
            neighborR = (double)image.at<uchar>(r+1, c) - (double)image.at<uchar>(r-1, c);
            neighborAngle = calAngle(neighborC, neighborR);
            neighborMag = pow(neighborC * neighborC + neighborR * neighborR, 0.5);
            neighborMag *= weight(c-center.x, r-center.y, 0.5 * block_width);

            if( 0 <= int(neighborAngle/45) && int(neighborAngle/45) <= 9){
                int bin = neighborAngle/45;
                double proportion = (neighborAngle-bin*45)/45.0 - 0.5;
                // cout << bin << "    " << proportion << "    " << 1-proportion << endl;
                
                if(proportion > 0){
                    tmpBin[bin] += (1-proportion) * neighborMag;
                    if(bin < tmpBin.size()-1){
                        tmpBin[bin+1] += proportion * neighborMag;
                    }
                    else
                        tmpBin[0] += proportion * neighborMag;
                }
                else{
                    tmpBin[bin] += 1-abs(proportion) * neighborMag;
                    if(bin > 0)
                        tmpBin[bin-1] += abs(proportion) * neighborMag;
                    else
                        tmpBin[tmpBin.size()-1] += abs(proportion) * neighborMag;
                }
            }
        }
    }
    Normalize(tmpBin);
    // ReNormalize(tmpBin);
    return tmpBin;
}